

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * __thiscall CVmRun::disp_string_val(CVmRun *this,uint caller_ofs,vm_obj_id_t self)

{
  uint uVar1;
  int iVar2;
  CVmObject *pCVar3;
  uchar *puVar4;
  uint in_EDX;
  undefined4 in_ESI;
  vm_val_t *in_RDI;
  vm_val_t *unaff_retaddr;
  vm_obj_id_t in_stack_00000008;
  uint in_stack_00000010;
  vm_rcdesc *in_stack_00000018;
  vm_val_t self_val;
  vm_val_t val;
  vm_obj_id_t src_obj;
  uint in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  uint argc;
  CVmRun *in_stack_ffffffffffffffc0;
  undefined1 local_30 [2];
  vm_obj_id_t in_stack_ffffffffffffffd4;
  vm_val_t *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  argc = (uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  if (((short)in_RDI[3].typ != 0) && (in_EDX != 0)) {
    pCVar3 = vm_objp(0);
    iVar2 = (*pCVar3->_vptr_CVmObject[0xd])
                      (pCVar3,(ulong)(ushort)(short)in_RDI[3].typ,local_30,(ulong)in_EDX,
                       &stack0xffffffffffffffe4,0);
    if ((iVar2 != 0) && (((_local_30 == 0xb || (_local_30 == 0x11)) || (_local_30 == 0x12)))) {
      vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffc0,in_EDX);
      uVar1 = (uint)_local_30 >> 0x10;
      puVar4 = eval_prop_val((CVmRun *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe4,
                             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                             in_stack_ffffffffffffffd4,(vm_prop_id_t)uVar1,unaff_retaddr,
                             in_stack_00000008,in_stack_00000010,in_stack_00000018);
      return puVar4;
    }
  }
  if ((in_RDI[2].val.ptr != (void *)0x0) && ((in_RDI[2].val.native_desc)->min_argc_ != 1)) {
    puVar4 = call_func_ptr(in_stack_ffffffffffffffc0,in_RDI,argc,
                           (vm_rcdesc *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           in_stack_ffffffffffffffa4);
    return puVar4;
  }
  err_throw(0);
}

Assistant:

const uchar *CVmRun::disp_string_val(VMG_ uint caller_ofs, vm_obj_id_t self)
{
    /* 
     *   if there's a valid 'self' object, and there's a default display
     *   method defined, and 'self' defines or inherits that method,
     *   invoke the method 
     */
    if (say_method_ != VM_INVALID_PROP && self != VM_INVALID_OBJ)
    {
        vm_obj_id_t src_obj;
        vm_val_t val;

        /* 
         *   look up the property - if we find it, and it's a regular
         *   method, invoke it 
         */
        if (vm_objp(vmg_ self)->get_prop(vmg_ say_method_, &val, self,
                                         &src_obj, 0)
            && (val.typ == VM_CODEOFS || val.typ == VM_OBJX
                || val.typ == VM_BIFPTRX))
        {
            /* set up a 'self' value - this is the target object */
            vm_val_t self_val;
            self_val.set_obj(self);

            /* there's a default display method - invoke it */
            return eval_prop_val(vmg_ TRUE, caller_ofs, &val, self,
                                 say_method_, &self_val, src_obj, 1, 0);
        }
    }
    
    /* if the "say" function isn't initialized, it's an error */
    if (say_func_ == 0 || say_func_->val.typ == VM_NIL)
        err_throw(VMERR_SAY_IS_NOT_DEFINED);

    /* call the "say" function with the argument at top of stack */
    return call_func_ptr(vmg_ &say_func_->val, 1, 0, caller_ofs);
}